

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stdout_sinks-inl.h
# Opt level: O2

shared_ptr<spdlog::logger>
spdlog::stdout_logger_st<spdlog::synchronous_factory>(string *logger_name)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  string *in_RSI;
  shared_ptr<spdlog::logger> sVar1;
  string local_30;
  
  std::__cxx11::string::string((string *)&local_30,in_RSI);
  synchronous_factory::create<spdlog::sinks::stdout_sink<spdlog::details::console_nullmutex>>
            ((synchronous_factory *)logger_name,&local_30);
  std::__cxx11::string::~string((string *)&local_30);
  sVar1.super___shared_ptr<spdlog::logger,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  sVar1.super___shared_ptr<spdlog::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)logger_name;
  return (shared_ptr<spdlog::logger>)
         sVar1.super___shared_ptr<spdlog::logger,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

SPDLOG_INLINE std::shared_ptr<logger> stdout_logger_st(const std::string &logger_name) {
    return Factory::template create<sinks::stdout_sink_st>(logger_name);
}